

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O1

LY_ERR lysp_stmt_extension(lysp_ctx *ctx,lysp_stmt *stmt,lysp_ext **extensions)

{
  lysp_ext_instance **exts;
  ly_stmt lVar1;
  lysp_ext *plVar2;
  lysc_ext *plVar3;
  long lVar4;
  LY_ERR LVar5;
  long *plVar6;
  char *pcVar7;
  char *pcVar8;
  uint32_t substmt_index;
  ly_ctx *plVar9;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_00;
  lysp_stmt *stmt_01;
  
  plVar2 = *extensions;
  if (plVar2 == (lysp_ext *)0x0) {
    plVar6 = (long *)malloc(0x40);
    if (plVar6 != (long *)0x0) {
      *plVar6 = 1;
      goto LAB_0016e995;
    }
  }
  else {
    plVar3 = plVar2[-1].compiled;
    plVar2[-1].compiled = (lysc_ext *)((long)&plVar3->name + 1);
    plVar6 = (long *)realloc(&plVar2[-1].compiled,(long)plVar3 * 0x38 + 0x40);
    if (plVar6 != (long *)0x0) {
LAB_0016e995:
      *extensions = (lysp_ext *)(plVar6 + 1);
      lVar4 = *plVar6;
      plVar6[lVar4 * 7 + -2] = 0;
      (plVar6 + lVar4 * 7 + -2)[1] = 0;
      plVar6[lVar4 * 7 + -4] = 0;
      (plVar6 + lVar4 * 7 + -4)[1] = 0;
      plVar6[lVar4 * 7 + -6] = 0;
      (plVar6 + lVar4 * 7 + -6)[1] = 0;
      plVar6[lVar4 * 7] = 0;
      LVar5 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
      if (LVar5 != LY_SUCCESS) {
        return LVar5 + (LVar5 == LY_SUCCESS);
      }
      if (ctx == (lysp_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar5 = lydict_insert(plVar9,stmt->arg,0,(char **)(plVar6 + lVar4 * 7 + -6));
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
      stmt_01 = stmt->child;
      if (stmt_01 == (lysp_stmt *)0x0) {
        return LY_SUCCESS;
      }
      plVar6 = plVar6 + lVar4 * 7;
      exts = (lysp_ext_instance **)(plVar6 + -2);
      do {
        lVar1 = stmt_01->kw;
        if ((int)lVar1 < 0xf0000) {
          if (lVar1 == LY_STMT_ARGUMENT) {
            if ((char *)plVar6[-5] == (char *)0x0) {
              LVar5 = lysp_stmt_validate_value(ctx,Y_PREF_IDENTIF_ARG,stmt_01->arg);
              if (LVar5 == LY_SUCCESS) {
                if (ctx == (lysp_ctx *)0x0) {
                  plVar9 = (ly_ctx *)0x0;
                }
                else {
                  plVar9 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                LVar5 = lydict_insert(plVar9,stmt_01->arg,0,(char **)(plVar6 + -5));
                if (LVar5 == LY_SUCCESS) {
                  for (stmt_00 = stmt_01->child; stmt_00 != (lysp_stmt *)0x0;
                      stmt_00 = stmt_00->next) {
                    lVar1 = stmt_00->kw;
                    if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
                      LVar5 = lysp_stmt_ext(ctx,stmt_00,stmt_01->kw,0,exts);
                    }
                    else {
                      if (lVar1 != LY_STMT_YIN_ELEMENT) {
                        if (ctx == (lysp_ctx *)0x0) {
                          plVar9 = (ly_ctx *)0x0;
                        }
                        else {
                          plVar9 = (ly_ctx *)
                                   **(undefined8 **)
                                     (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1]
                          ;
                        }
                        pcVar7 = lyplg_ext_stmt2str(lVar1);
                        in_R9 = (lysp_ext_instance **)lyplg_ext_stmt2str(LY_STMT_ARGUMENT);
                        ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,
                                "Invalid keyword \"%s\" as a child of \"%s\".",pcVar7);
                        goto LAB_0016ebec;
                      }
                      LVar5 = lysp_stmt_yinelem(ctx,stmt_00,(uint16_t *)(plVar6 + -1),exts);
                    }
                    if (LVar5 != LY_SUCCESS) goto joined_r0x0016ebf3;
                  }
                  LVar5 = LY_SUCCESS;
                }
              }
            }
            else {
              if (ctx == (lysp_ctx *)0x0) {
                plVar9 = (ly_ctx *)0x0;
              }
              else {
                plVar9 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","argument");
LAB_0016ebec:
              LVar5 = LY_EVALID;
            }
          }
          else {
            substmt_index = (int)plVar6 - 0x20;
            if (lVar1 != LY_STMT_DESCRIPTION) {
LAB_0016ecd2:
              if (ctx == (lysp_ctx *)0x0) {
                plVar9 = (ly_ctx *)0x0;
              }
              else {
                plVar9 = (ly_ctx *)
                         **(undefined8 **)
                           (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              }
              pcVar7 = lyplg_ext_stmt2str(lVar1);
              pcVar8 = lyplg_ext_stmt2str(LY_STMT_EXTENSION);
              ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,
                      "Invalid keyword \"%s\" as a child of \"%s\".",pcVar7,pcVar8);
              return LY_EVALID;
            }
LAB_0016eb22:
            LVar5 = lysp_stmt_text_field
                              (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
          }
        }
        else if (lVar1 == LY_STMT_EXTENSION_INSTANCE) {
          LVar5 = lysp_stmt_ext(ctx,stmt_01,stmt->kw,0,exts);
        }
        else {
          substmt_index = (int)plVar6 - 0x18;
          if (lVar1 == LY_STMT_REFERENCE) goto LAB_0016eb22;
          if (lVar1 != LY_STMT_STATUS) goto LAB_0016ecd2;
          LVar5 = lysp_stmt_status(ctx,stmt_01,(uint16_t *)(plVar6 + -1),exts);
        }
joined_r0x0016ebf3:
        if (LVar5 != LY_SUCCESS) {
          return LVar5;
        }
        stmt_01 = stmt_01->next;
        if (stmt_01 == (lysp_stmt *)0x0) {
          return LY_SUCCESS;
        }
      } while( true );
    }
    (*extensions)[-1].compiled = (lysc_ext *)&(*extensions)[-1].compiled[-1].field_0x2f;
  }
  if (ctx == (lysp_ctx *)0x0) {
    plVar9 = (ly_ctx *)0x0;
  }
  else {
    plVar9 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  ly_log(plVar9,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_extension");
  return LY_EMEM;
}

Assistant:

static LY_ERR
lysp_stmt_extension(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_ext **extensions)
{
    struct lysp_ext *ex;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *extensions, ex, LY_EMEM);

    /* store name */
    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &ex->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &ex->dsc, Y_STR_ARG, &ex->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &ex->ref, Y_STR_ARG, &ex->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &ex->flags, &ex->exts));
            break;
        case LY_STMT_ARGUMENT:
            LY_CHECK_RET(lysp_stmt_argument(ctx, child, ex));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, stmt->kw, 0, &ex->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), lyplg_ext_stmt2str(LY_STMT_EXTENSION));
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}